

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initiator.cpp
# Opt level: O0

bool __thiscall FIX::Initiator::isPending(Initiator *this,SessionID *sessionID)

{
  bool bVar1;
  _Self local_40 [3];
  _Self local_28;
  Locker local_20;
  Locker l;
  SessionID *sessionID_local;
  Initiator *this_local;
  
  l.m_mutex = (Mutex *)sessionID;
  Locker::Locker(&local_20,&this->m_mutex);
  local_28._M_node =
       (_Base_ptr)
       std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::find
                 (&this->m_pending,(key_type *)l.m_mutex);
  local_40[0]._M_node =
       (_Base_ptr)
       std::set<FIX::SessionID,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>::end
                 (&this->m_pending);
  bVar1 = std::operator!=(&local_28,local_40);
  Locker::~Locker(&local_20);
  return bVar1;
}

Assistant:

bool Initiator::isPending( const SessionID& sessionID )
{
  Locker l(m_mutex);
  return m_pending.find( sessionID ) != m_pending.end();
}